

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetIDWithSeed(int n,ImGuiID seed)

{
  ImGuiID IVar1;
  ImGuiID in_ESI;
  ImGuiContext *g;
  ImGuiID id;
  void *in_stack_00000080;
  void *in_stack_00000088;
  ImGuiDataType in_stack_00000090;
  ImGuiID in_stack_00000094;
  undefined1 local_4 [4];
  
  IVar1 = ImHashData(local_4,4,in_ESI);
  if (GImGui->DebugHookIdInfo == IVar1) {
    DebugHookIdInfo(in_stack_00000094,in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetIDWithSeed(int n, ImGuiID seed)
{
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        DebugHookIdInfo(id, ImGuiDataType_S32, (void*)(intptr_t)n, NULL);
#endif
    return id;
}